

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word * Gia_ObjComputeTruthTableCut(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves)

{
  Vec_Int_t *p_00;
  Vec_Wrd_t *p_01;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  word *pwVar4;
  ulong *local_b0;
  word *local_a8;
  int Id1;
  int Id0;
  int iObj;
  int i;
  word *pTruth1;
  word *pTruth0;
  word *pTruthL;
  word *pTruth;
  Gia_Obj_t *pTemp;
  Vec_Int_t *vLeaves_local;
  Gia_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vTtMemory != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x289,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  iVar1 = Vec_IntSize(vLeaves);
  if (iVar1 <= p->nTtVars) {
    iVar1 = Vec_IntSize(p->vTtNums);
    iVar2 = Gia_ManObjNum(p);
    if (iVar1 < iVar2) {
      p_00 = p->vTtNums;
      iVar1 = Gia_ManObjNum(p);
      Vec_IntFillExtra(p_00,iVar1,-1000000000);
    }
    iVar1 = Gia_ObjId(p,pRoot);
    Gia_ObjCollectInternalCut(p,iVar1,vLeaves);
    iVar2 = Vec_WrdSize(p->vTtMemory);
    iVar1 = p->nTtWords;
    iVar3 = Vec_IntSize(p->vTtNodes);
    if (iVar2 < iVar1 * (iVar3 + 2)) {
      p_01 = p->vTtMemory;
      iVar1 = p->nTtWords;
      iVar2 = Vec_IntSize(p->vTtNodes);
      Vec_WrdFillExtra(p_01,iVar1 * (iVar2 + 2),0);
    }
    Id0 = 1;
    while( true ) {
      iVar1 = Vec_IntSize(p->vTtNodes);
      if (iVar1 <= Id0) {
        pwVar4 = Gla_ObjTruthNode(p,pRoot);
        for (Id0 = 0; iVar1 = Vec_IntSize(vLeaves), Id0 < iVar1; Id0 = Id0 + 1) {
          iVar1 = Vec_IntEntry(vLeaves,Id0);
          Gia_ObjResetNumId(p,iVar1);
        }
        for (Id0 = 1; iVar1 = Vec_IntSize(p->vTtNodes), Id0 < iVar1; Id0 = Id0 + 1) {
          iVar1 = Vec_IntEntry(p->vTtNodes,Id0);
          Gia_ObjResetNumId(p,iVar1);
        }
        return pwVar4;
      }
      iVar1 = Vec_IntEntry(p->vTtNodes,Id0);
      iVar2 = Gia_ObjNumId(p,iVar1);
      if (Id0 != iVar2) break;
      pObj = Gia_ManObj(p,iVar1);
      pTruthL = Gla_ObjTruthNodeId(p,Id0);
      pwVar4 = pTruthL + p->nTtWords;
      iVar2 = Gia_ObjFaninId0(pObj,iVar1);
      iVar2 = Gia_ObjNumId(p,iVar2);
      iVar1 = Gia_ObjFaninId1(pObj,iVar1);
      iVar1 = Gia_ObjNumId(p,iVar1);
      if (iVar2 < 1) {
        local_a8 = Gla_ObjTruthElem(p,-iVar2);
      }
      else {
        local_a8 = Gla_ObjTruthNodeId(p,iVar2);
      }
      pTruth1 = local_a8;
      if (iVar1 < 1) {
        local_b0 = Gla_ObjTruthElem(p,-iVar1);
      }
      else {
        local_b0 = Gla_ObjTruthNodeId(p,iVar1);
      }
      _iObj = local_b0;
      iVar1 = Gia_ObjFaninC0(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninC1(pObj);
        if (iVar1 == 0) {
          while (pTruthL < pwVar4) {
            *pTruthL = *pTruth1 & *_iObj;
            _iObj = _iObj + 1;
            pTruth1 = pTruth1 + 1;
            pTruthL = pTruthL + 1;
          }
        }
        else {
          while (pTruthL < pwVar4) {
            *pTruthL = *pTruth1 & (*_iObj ^ 0xffffffffffffffff);
            _iObj = _iObj + 1;
            pTruth1 = pTruth1 + 1;
            pTruthL = pTruthL + 1;
          }
        }
      }
      else {
        iVar1 = Gia_ObjFaninC1(pObj);
        if (iVar1 == 0) {
          while (pTruthL < pwVar4) {
            *pTruthL = (*pTruth1 ^ 0xffffffffffffffff) & *_iObj;
            _iObj = _iObj + 1;
            pTruth1 = pTruth1 + 1;
            pTruthL = pTruthL + 1;
          }
        }
        else {
          while (pTruthL < pwVar4) {
            *pTruthL = (*pTruth1 ^ 0xffffffffffffffff) & (*_iObj ^ 0xffffffffffffffff);
            _iObj = _iObj + 1;
            pTruth1 = pTruth1 + 1;
            pTruthL = pTruthL + 1;
          }
        }
      }
      Id0 = Id0 + 1;
    }
    __assert_fail("i == Gia_ObjNumId(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x296,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  __assert_fail("Vec_IntSize(vLeaves) <= p->nTtVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                ,0x28a,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

word * Gia_ObjComputeTruthTableCut( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pTemp;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i, iObj, Id0, Id1;
    assert( p->vTtMemory != NULL );
    assert( Vec_IntSize(vLeaves) <= p->nTtVars );
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), -ABC_INFINITY );
    // collect internal nodes
    Gia_ObjCollectInternalCut( p, Gia_ObjId(p, pRoot), vLeaves );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
    {
        assert( i == Gia_ObjNumId(p, iObj) );
        pTemp   = Gia_ManObj( p, iObj );
        pTruth  = Gla_ObjTruthNodeId( p, i );  
        pTruthL = pTruth + p->nTtWords;
        Id0 = Gia_ObjNumId( p, Gia_ObjFaninId0(pTemp, iObj) );
        Id1 = Gia_ObjNumId( p, Gia_ObjFaninId1(pTemp, iObj) );
        pTruth0 = (Id0 > 0) ? Gla_ObjTruthNodeId(p, Id0) : Gla_ObjTruthElem(p, -Id0);
        pTruth1 = (Id1 > 0) ? Gla_ObjTruthNodeId(p, Id1) : Gla_ObjTruthElem(p, -Id1);
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    pTruth = Gla_ObjTruthNode( p, pRoot );
    // unmark leaves marked by Gia_ObjCollectInternal()
    Vec_IntForEachEntry( vLeaves, iObj, i )
        Gia_ObjResetNumId( p, iObj );
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
        Gia_ObjResetNumId( p, iObj );
    return pTruth;
}